

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O2

Aig_Obj_t * Bdc_FunCopyHop(Bdc_Fun_t *pObj)

{
  void *pvVar1;
  
  pvVar1 = Bdc_FuncCopy((Bdc_Fun_t *)((ulong)pObj & 0xfffffffffffffffe));
  return (Aig_Obj_t *)((ulong)pvVar1 ^ (ulong)((uint)pObj & 1));
}

Assistant:

static inline Aig_Obj_t * Bdc_FunCopyHop( Bdc_Fun_t * pObj )  
{ return Aig_NotCond( (Aig_Obj_t *)Bdc_FuncCopy(Bdc_Regular(pObj)), Bdc_IsComplement(pObj) );  }